

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

string_t * __thiscall
cfgfile::tag_scalar_t<int,cfgfile::string_trait_t>::print_abi_cxx11_
          (string_t *__return_storage_ptr__,void *this,int indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  bool bVar3;
  long *plVar4;
  int *value_00;
  char cVar5;
  undefined8 *puVar6;
  string_t value;
  string_t local_80;
  string_t local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  long local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar3 = tag_t<cfgfile::string_trait_t>::is_defined((tag_t<cfgfile::string_trait_t> *)this);
  if (bVar3) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_40 = &__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)indent);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    cVar5 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)((long)this + 8));
    std::__cxx11::string::push_back(cVar5);
    format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_
              (&local_80,(format_t<int,cfgfile::string_trait_t> *)((long)this + 0x60),value_00);
    local_38 = (long)indent;
    to_cfgfile_format<cfgfile::string_trait_t>(&local_60,&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p)
    ;
    plVar4 = (long *)(**(code **)(*this + 0x10))(this);
    if (*plVar4 != plVar4[1]) {
      std::__cxx11::string::push_back(cVar5);
      plVar4 = (long *)(**(code **)(*this + 0x10))(this);
      puVar6 = (undefined8 *)*plVar4;
      puVar2 = (undefined8 *)plVar4[1];
      if (puVar6 != puVar2) {
        do {
          (**(code **)(*(long *)*puVar6 + 0x18))(&local_60,(long *)*puVar6,indent + 1);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar1) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar2);
      }
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_60,(char)local_38);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			typename Trait::string_t value =
				format_t< T, Trait >::to_string( m_value );
			value = to_cfgfile_format< Trait >( value );

			result.append( value );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}